

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O3

void __thiscall
cmCTestBuildHandler::LaunchHelper::LaunchHelper(LaunchHelper *this,cmCTestBuildHandler *handler)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *source;
  cmCTest *this_00;
  cmCTestBuildHandler *pcVar2;
  byte bVar3;
  string launchEnv;
  string tag;
  string local_60;
  string local_40;
  
  this->Handler = handler;
  this_00 = (handler->super_cmCTestGenericHandler).CTest;
  this->CTest = this_00;
  cmCTest::GetCurrentTag_abi_cxx11_(&local_40,this_00);
  pcVar2 = this->Handler;
  if (local_40._M_string_length == 0) {
    pcVar2->UseCTestLaunch = false;
  }
  else {
    cmCTest::GetBinaryDir_abi_cxx11_(&local_60,this->CTest);
    source = &pcVar2->CTestLaunchDir;
    std::__cxx11::string::operator=((string *)source,(string *)&local_60);
    paVar1 = &local_60.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)source);
    std::__cxx11::string::_M_append((char *)source,(ulong)local_40._M_dataplus._M_p);
    std::__cxx11::string::append((char *)source);
    cmsys::SystemTools::RemoveADirectory(source);
    bVar3 = this->Handler->UseCTestLaunch;
    if ((bool)bVar3 == true) {
      cmsys::SystemTools::MakeDirectory(source,(mode_t *)0x0);
      WriteLauncherConfig(this);
      local_60._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"CTEST_LAUNCH_LOGS=","");
      std::__cxx11::string::_M_append
                ((char *)&local_60,(ulong)(pcVar2->CTestLaunchDir)._M_dataplus._M_p);
      cmsys::SystemTools::PutEnv(&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar1) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      bVar3 = this->Handler->UseCTestLaunch;
    }
    if ((bVar3 & 1) != 0) goto LAB_00164d07;
  }
  cmSystemTools::UnsetEnv("CTEST_LAUNCH_LOGS");
LAB_00164d07:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

cmCTestBuildHandler::LaunchHelper::LaunchHelper(cmCTestBuildHandler* handler)
  : Handler(handler)
  , CTest(handler->CTest)
{
  std::string tag = this->CTest->GetCurrentTag();
  if (tag.empty()) {
    // This is not for a dashboard submission, so there is no XML.
    // Skip enabling the launchers.
    this->Handler->UseCTestLaunch = false;
  } else {
    // Compute a directory in which to store launcher fragments.
    std::string& launchDir = this->Handler->CTestLaunchDir;
    launchDir = this->CTest->GetBinaryDir();
    launchDir += "/Testing/";
    launchDir += tag;
    launchDir += "/Build";

    // Clean out any existing launcher fragments.
    cmSystemTools::RemoveADirectory(launchDir);

    if (this->Handler->UseCTestLaunch) {
      // Enable launcher fragments.
      cmSystemTools::MakeDirectory(launchDir);
      this->WriteLauncherConfig();
      std::string launchEnv = "CTEST_LAUNCH_LOGS=";
      launchEnv += launchDir;
      cmSystemTools::PutEnv(launchEnv);
    }
  }

  // If not using launchers, make sure they passthru.
  if (!this->Handler->UseCTestLaunch) {
    cmSystemTools::UnsetEnv("CTEST_LAUNCH_LOGS");
  }
}